

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.cpp
# Opt level: O0

string * normalize_char_name(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  allocator local_39;
  reference local_38;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string *s_local;
  
  uVar3 = std::__cxx11::string::length();
  if (uVar3 < 2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    __end2._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
      iVar2 = tolower((int)*local_38);
      *local_38 = (char)iVar2;
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
            ::count(&charnames_abi_cxx11_,s);
    if (sVar4 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalize_char_name(std::string s)
{
    if(s.length() > 1)
    {
        for(char &c : s)
            c = tolower(c);
        return charnames.count(s) ? s : "";
    }
    return s;
}